

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  string *psVar1;
  TestProperty *pTVar2;
  Message *pMVar3;
  int i;
  Message attributes;
  allocator<char> local_89;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_80 = __return_storage_ptr__;
  Message::Message((Message *)&local_88);
  for (i = 0; psVar1 = local_80,
      i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                       (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                             _vptr_TestEventListener) >> 6); i = i + 1) {
    pTVar2 = TestResult::GetTestProperty((TestResult *)this,i);
    std::operator<<((ostream *)(local_88.ptr_ + 0x10)," ");
    local_78 = (pTVar2->key_)._M_dataplus._M_p;
    pMVar3 = Message::operator<<((Message *)&local_88,&local_78);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x121b64);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x1203db);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(pTVar2->value_)._M_dataplus._M_p,&local_89);
    EscapeXmlAttribute(&local_50,&local_70);
    pMVar3 = Message::operator<<(pMVar3,&local_50);
    Message::operator<<(pMVar3,(char (*) [2])0x1203db);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  StringStreamToString(local_80,local_88.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_88);
  return psVar1;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}